

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_Support_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vSupp_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCi(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if ((iVar1 == 0) && (iVar1 = Aig_ObjIsBuf(pObj), iVar1 == 0)) {
          __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                        ,0x32f,"void Aig_Support_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Aig_Support_rec(p,pAVar2,vSupp);
        pAVar2 = Aig_ObjFanin1(pObj);
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          pAVar2 = Aig_ObjFanin1(pObj);
          Aig_Support_rec(p,pAVar2,vSupp);
        }
      }
      else {
        Vec_PtrPush(vSupp,pObj);
      }
    }
  }
  return;
}

Assistant:

void Aig_Support_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_Support_rec( p, Aig_ObjFanin0(pObj), vSupp );
    if ( Aig_ObjFanin1(pObj) )
        Aig_Support_rec( p, Aig_ObjFanin1(pObj), vSupp );
}